

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O1

pboolean p_tree_rb_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                         pconstpointer key)

{
  PTreeRBNode *pPVar1;
  pint pVar2;
  PTreeRBNode *pPVar3;
  PTreeRBNode_ *pPVar4;
  PTreeRBNode *node;
  PTreeBaseNode_ *pPVar5;
  
  node = (PTreeRBNode *)*root_node;
  do {
    if (node == (PTreeRBNode *)0x0) {
      return 0;
    }
    pVar2 = (*compare_func)(key,(node->base).key,data);
    if (-1 < pVar2) {
      if (pVar2 == 0) {
        pPVar1 = (PTreeRBNode *)(node->base).left;
        if ((pPVar1 != (PTreeRBNode *)0x0) && ((node->base).right != (PTreeBaseNode_ *)0x0)) {
          do {
            pPVar3 = pPVar1;
            pPVar1 = (PTreeRBNode *)(pPVar3->base).right;
          } while (pPVar1 != (PTreeRBNode *)0x0);
          (node->base).key = (pPVar3->base).key;
          (node->base).value = (pPVar3->base).value;
          node = pPVar3;
        }
        pPVar5 = (node->base).left;
        if (pPVar5 == (PTreeBaseNode_ *)0x0) {
          pPVar5 = (node->base).right;
        }
        if ((pPVar5 == (PTreeBaseNode_ *)0x0) && ((node->color & P_TREE_RB_COLOR_BLACK) != 0)) {
          pp_tree_rb_balance_remove(node,root_node);
        }
        if (node == (PTreeRBNode *)*root_node) {
          pPVar4 = (PTreeRBNode_ *)0x0;
        }
        else {
          pPVar4 = node->parent;
          root_node = &(pPVar4->base).left + ((PTreeRBNode *)(pPVar4->base).left != node);
        }
        *root_node = pPVar5;
        if ((pPVar5 != (PTreeBaseNode_ *)0x0) &&
           (pPVar5[1].left = &pPVar4->base, (node->color & P_TREE_RB_COLOR_BLACK) != 0)) {
          *(undefined4 *)&pPVar5[1].right = 2;
        }
        if (key_destroy_func != (PDestroyFunc)0x0) {
          (*key_destroy_func)((node->base).key);
        }
        if (value_destroy_func != (PDestroyFunc)0x0) {
          (*value_destroy_func)((node->base).value);
        }
        p_free(node);
        return 1;
      }
      node = (PTreeRBNode *)&(node->base).right;
    }
    node = (PTreeRBNode *)(node->base).left;
  } while( true );
}

Assistant:

pboolean
p_tree_rb_remove (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  pconstpointer		key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	*child_node;
	PTreeRBNode	*child_parent;
	pint		cmp_result;

	cur_node = *root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		prev_node = cur_node->left;

		while (prev_node->right != NULL)
			prev_node = prev_node->right;

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		/* Mark node for removal */
		cur_node = prev_node;
	}

	child_node = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (child_node == NULL && pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
		pp_tree_rb_balance_remove ((PTreeRBNode *) cur_node, root_node);

	/* Replace node with its child */
	if (cur_node == *root_node) {
		*root_node   = child_node;
		child_parent = NULL;
	} else {
		child_parent = ((PTreeRBNode *) cur_node)->parent;

		if (child_parent->base.left == cur_node)
			child_parent->base.left = child_node;
		else
			child_parent->base.right = child_node;
	}

	if (child_node != NULL) {
		((PTreeRBNode *) child_node)->parent = child_parent;

		/* Check if we need to repaint the node */
		if (pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
				((PTreeRBNode *) child_node)->color = P_TREE_RB_COLOR_BLACK;
	}

	/* Free unused node */
	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}